

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetic.h
# Opt level: O0

double __thiscall FastPForLib::ZipfianGenerator::zeta(ZipfianGenerator *this,int nn,double ttheta)

{
  int in_ESI;
  double in_XMM0_Qa;
  double dVar1;
  long i;
  double sum;
  undefined8 local_28;
  undefined8 local_20;
  
  local_20 = 0.0;
  for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
    dVar1 = pow((double)(local_28 + 1),in_XMM0_Qa);
    local_20 = 1.0 / dVar1 + local_20;
  }
  return local_20;
}

Assistant:

double zeta(int nn, double ttheta) {
    double sum = 0;
    for (long i = 0; i < nn; i++) {
      sum += 1.0 / (pow(static_cast<double>(i + 1), ttheta));
    }
    return sum;
  }